

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

Expected<llvm::DWARFDebugNames::AttributeEncoding> __thiscall
llvm::DWARFDebugNames::NameIndex::extractAttributeEncoding(NameIndex *this,uint64_t *Offset)

{
  uint64_t uVar1;
  uint64_t *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  Expected<llvm::DWARFDebugNames::AttributeEncoding> EVar3;
  error_code EC;
  AttributeEncoding local_54;
  undefined4 local_4c;
  Index local_48;
  uint32_t Form;
  uint32_t Index;
  error_code local_38;
  Error local_28;
  uint64_t *local_20;
  uint64_t *Offset_local;
  NameIndex *this_local;
  
  Offset_local = Offset;
  this_local = this;
  if (*in_RDX < Offset[0x12]) {
    local_20 = in_RDX;
    uVar1 = DataExtractor::getULEB128((DataExtractor *)(Offset[0xb] + 8),in_RDX,(Error *)0x0);
    local_48 = (Index)uVar1;
    uVar1 = DataExtractor::getULEB128((DataExtractor *)(Offset[0xb] + 8),local_20,(Error *)0x0);
    local_4c = (undefined4)uVar1;
    AttributeEncoding::AttributeEncoding(&local_54,local_48,(Form)uVar1);
    Expected<llvm::DWARFDebugNames::AttributeEncoding>::
    Expected<llvm::DWARFDebugNames::AttributeEncoding>
              ((Expected<llvm::DWARFDebugNames::AttributeEncoding> *)this,&local_54,(type *)0x0);
    uVar2 = extraout_RDX_00;
  }
  else {
    std::error_code::error_code<llvm::errc,void>(&local_38,illegal_byte_sequence);
    EC._M_cat._0_4_ = local_38._M_value;
    EC._0_8_ = &local_28;
    EC._M_cat._4_4_ = 0;
    createStringError(EC,(char *)local_38._M_cat);
    Expected<llvm::DWARFDebugNames::AttributeEncoding>::Expected
              ((Expected<llvm::DWARFDebugNames::AttributeEncoding> *)this,&local_28);
    Error::~Error(&local_28);
    uVar2 = extraout_RDX;
  }
  EVar3._8_8_ = uVar2;
  EVar3.field_0 =
       (anon_union_8_2_427f0595_for_Expected<llvm::DWARFDebugNames::AttributeEncoding>_2)this;
  return EVar3;
}

Assistant:

Expected<DWARFDebugNames::AttributeEncoding>
DWARFDebugNames::NameIndex::extractAttributeEncoding(uint64_t *Offset) {
  if (*Offset >= EntriesBase) {
    return createStringError(errc::illegal_byte_sequence,
                             "Incorrectly terminated abbreviation table.");
  }

  uint32_t Index = Section.AccelSection.getULEB128(Offset);
  uint32_t Form = Section.AccelSection.getULEB128(Offset);
  return AttributeEncoding(dwarf::Index(Index), dwarf::Form(Form));
}